

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void printValueTree(FILE *fout,Value *value,string *path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double dVar2;
  undefined8 uVar3;
  bool bVar4;
  ValueType VVar5;
  ArrayIndex AVar6;
  Json *pJVar7;
  size_t sVar8;
  long lVar9;
  ulong uVar10;
  Value *pVVar11;
  long *plVar12;
  ulong *puVar13;
  LargestUInt value_00;
  LargestInt value_01;
  pointer pcVar14;
  char *pcVar15;
  undefined8 uVar16;
  string *psVar17;
  uint uVar18;
  char buffer_1 [32];
  string s;
  string exponent;
  string normalized;
  string local_d8;
  string local_b0;
  undefined1 local_90 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar4 = Json::Value::hasComment(value,commentBefore);
  if (bVar4) {
    Json::Value::getComment_abi_cxx11_(&local_d8,value,commentBefore);
    fprintf((FILE *)fout,"%s\n",local_d8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
  }
  VVar5 = Json::Value::type(value);
  switch(VVar5) {
  case nullValue:
    fprintf((FILE *)fout,"%s=null\n",(path->_M_dataplus)._M_p);
    break;
  case intValue:
    pcVar14 = (path->_M_dataplus)._M_p;
    pJVar7 = (Json *)Json::Value::asLargestInt(value);
    Json::valueToString_abi_cxx11_(&local_d8,pJVar7,value_01);
    goto LAB_001106ee;
  case uintValue:
    pcVar14 = (path->_M_dataplus)._M_p;
    pJVar7 = (Json *)Json::Value::asLargestUInt(value);
    Json::valueToString_abi_cxx11_(&local_d8,pJVar7,value_00);
LAB_001106ee:
    pcVar15 = "%s=%s\n";
LAB_001106f8:
    fprintf((FILE *)fout,pcVar15,pcVar14,local_d8._M_dataplus._M_p);
    uVar16 = local_d8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
LAB_0011089a:
      operator_delete((void *)uVar16);
    }
    break;
  case realValue:
    pcVar14 = (path->_M_dataplus)._M_p;
    dVar2 = Json::Value::asDouble(value);
    snprintf((char *)&local_d8,0x20,"%.16g",SUB84(dVar2,0));
    local_d8.field_2._M_local_buf[0xf] = '\0';
    paVar1 = &local_b0.field_2;
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    sVar8 = strlen((char *)&local_d8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,&local_d8,(long)&local_d8._M_dataplus._M_p + sVar8);
    lVar9 = std::__cxx11::string::find_last_of((char *)&local_b0,0x124227,0xffffffffffffffff);
    if (lVar9 == -1) {
      local_70._M_allocated_capacity = (size_type)&local_60;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p == paVar1) {
        local_60._8_8_ = local_b0.field_2._8_8_;
      }
      else {
        local_70._M_allocated_capacity = (size_type)local_b0._M_dataplus._M_p;
      }
      local_70._8_8_ = local_b0._M_string_length;
      local_b0._M_string_length = 0;
      local_b0.field_2._M_allocated_capacity =
           local_b0.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_b0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_b0);
      lVar9 = std::__cxx11::string::find_first_not_of((char)&local_b0,0x30);
      psVar17 = (string *)(local_90 + 0x10);
      local_90._16_2_ = 0x30;
      local_90._8_8_ = (string *)0x1;
      local_90._0_8_ = psVar17;
      if (lVar9 != -1) {
        std::__cxx11::string::substr((ulong)&local_70,(ulong)&local_b0);
        std::__cxx11::string::operator=((string *)local_90,(string *)local_70._M_local_buf);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_allocated_capacity != &local_60) {
          operator_delete((void *)local_70._M_allocated_capacity);
        }
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70,
                     &local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
      if ((string *)local_90._0_8_ != psVar17) {
        operator_delete((void *)local_90._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    fprintf((FILE *)fout,"%s=%s\n",pcVar14,local_70._M_allocated_capacity);
    uVar16 = local_70._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_allocated_capacity == &local_60) break;
    goto LAB_0011089a;
  case stringValue:
    pcVar14 = (path->_M_dataplus)._M_p;
    Json::Value::asString_abi_cxx11_(&local_d8,value);
    pcVar15 = "%s=\"%s\"\n";
    goto LAB_001106f8;
  case booleanValue:
    pcVar14 = (path->_M_dataplus)._M_p;
    bVar4 = Json::Value::asBool(value);
    pcVar15 = "false";
    if (bVar4) {
      pcVar15 = "true";
    }
    fprintf((FILE *)fout,"%s=%s\n",pcVar14,pcVar15);
    break;
  case arrayValue:
    fprintf((FILE *)fout,"%s=[]\n",(path->_M_dataplus)._M_p);
    AVar6 = Json::Value::size(value);
    if (0 < (int)AVar6) {
      uVar10 = 0;
      do {
        snprintf(printValueTree::buffer,0x10,"[%d]",uVar10);
        pVVar11 = Json::Value::operator[](value,(int)uVar10);
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        pcVar14 = (path->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d8,pcVar14,pcVar14 + path->_M_string_length);
        std::__cxx11::string::append((char *)&local_d8);
        printValueTree(fout,pVVar11,&local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p);
        }
        uVar18 = (int)uVar10 + 1;
        uVar10 = (ulong)uVar18;
      } while (AVar6 != uVar18);
    }
    break;
  case objectValue:
    fprintf((FILE *)fout,"%s={}\n",(path->_M_dataplus)._M_p);
    Json::Value::getMemberNames_abi_cxx11_((Members *)local_90,value);
    uVar3 = local_90._8_8_;
    uVar16 = local_90._0_8_;
    if (local_90._0_8_ != local_90._8_8_) {
      uVar10 = (long)(local_90._8_8_ - local_90._0_8_) >> 5;
      lVar9 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar9 == 0; lVar9 = lVar9 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_90._0_8_,local_90._8_8_,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (uVar16,uVar3);
    }
    bVar4 = (path->_M_dataplus)._M_p[path->_M_string_length - 1] != '.';
    pcVar15 = "";
    if (bVar4) {
      pcVar15 = ".";
    }
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,pcVar15,pcVar15 + bVar4);
    if (local_90._0_8_ != local_90._8_8_) {
      psVar17 = (string *)local_90._0_8_;
      do {
        pVVar11 = Json::Value::operator[](value,psVar17);
        std::operator+(&local_50,path,&local_d8);
        plVar12 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_50,(ulong)(psVar17->_M_dataplus)._M_p);
        puVar13 = (ulong *)(plVar12 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_b0.field_2._M_allocated_capacity = *puVar13;
          local_b0.field_2._8_8_ = plVar12[3];
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        }
        else {
          local_b0.field_2._M_allocated_capacity = *puVar13;
          local_b0._M_dataplus._M_p = (pointer)*plVar12;
        }
        local_b0._M_string_length = plVar12[1];
        *plVar12 = (long)puVar13;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        printValueTree(fout,pVVar11,&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        psVar17 = psVar17 + 1;
      } while (psVar17 != (string *)local_90._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_90);
  }
  bVar4 = Json::Value::hasComment(value,commentAfter);
  if (bVar4) {
    Json::Value::getComment_abi_cxx11_(&local_d8,value,commentAfter);
    fprintf((FILE *)fout,"%s\n",local_d8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

static void
printValueTree(FILE* fout, Json::Value& value, const std::string& path = ".") {
  if (value.hasComment(Json::commentBefore)) {
    fprintf(fout, "%s\n", value.getComment(Json::commentBefore).c_str());
  }
  switch (value.type()) {
  case Json::nullValue:
    fprintf(fout, "%s=null\n", path.c_str());
    break;
  case Json::intValue:
    fprintf(fout,
            "%s=%s\n",
            path.c_str(),
            Json::valueToString(value.asLargestInt()).c_str());
    break;
  case Json::uintValue:
    fprintf(fout,
            "%s=%s\n",
            path.c_str(),
            Json::valueToString(value.asLargestUInt()).c_str());
    break;
  case Json::realValue:
    fprintf(fout,
            "%s=%s\n",
            path.c_str(),
            normalizeFloatingPointStr(value.asDouble()).c_str());
    break;
  case Json::stringValue:
    fprintf(fout, "%s=\"%s\"\n", path.c_str(), value.asString().c_str());
    break;
  case Json::booleanValue:
    fprintf(fout, "%s=%s\n", path.c_str(), value.asBool() ? "true" : "false");
    break;
  case Json::arrayValue: {
    fprintf(fout, "%s=[]\n", path.c_str());
    int size = value.size();
    for (int index = 0; index < size; ++index) {
      static char buffer[16];
#if defined(_MSC_VER) && defined(__STDC_SECURE_LIB__)
      sprintf_s(buffer, sizeof(buffer), "[%d]", index);
#else
      snprintf(buffer, sizeof(buffer), "[%d]", index);
#endif
      printValueTree(fout, value[index], path + buffer);
    }
  } break;
  case Json::objectValue: {
    fprintf(fout, "%s={}\n", path.c_str());
    Json::Value::Members members(value.getMemberNames());
    std::sort(members.begin(), members.end());
    std::string suffix = *(path.end() - 1) == '.' ? "" : ".";
    for (Json::Value::Members::iterator it = members.begin();
         it != members.end();
         ++it) {
      const std::string& name = *it;
      printValueTree(fout, value[name], path + suffix + name);
    }
  } break;
  default:
    break;
  }

  if (value.hasComment(Json::commentAfter)) {
    fprintf(fout, "%s\n", value.getComment(Json::commentAfter).c_str());
  }
}